

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O0

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  bool bVar1;
  MatchClass opc;
  int extraout_EAX;
  Expr *expr;
  BasicBlock *pBVar2;
  MatchInstr *this_00;
  CaseList *this_01;
  pointer stmt;
  pointer expr_00;
  Stmt *pSVar3;
  undefined4 in_register_00000034;
  allocator<char> local_109;
  string local_108;
  BasicBlock *local_e8;
  BasicBlock *elseBlock;
  Constant *label;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *labelNode;
  const_iterator __end3;
  const_iterator __begin3;
  list<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  *__range3;
  string local_b0;
  BasicBlock *local_90;
  BasicBlock *bb;
  Case *one;
  iterator __end2;
  iterator __begin2;
  CaseList *__range2;
  MatchInstr *matchInstr;
  allocator<char> local_49;
  string local_48;
  BasicBlock *local_28;
  BasicBlock *contBlock;
  Value *cond;
  MatchStmt *matchStmt_local;
  IRGenerator *this_local;
  
  cond = (Value *)CONCAT44(in_register_00000034,__fd);
  matchStmt_local = (MatchStmt *)this;
  expr = MatchStmt::condition((MatchStmt *)cond);
  contBlock = (BasicBlock *)codegen(this,expr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"match.cont",&local_49);
  pBVar2 = IRBuilder::createBlock(&this->super_IRBuilder,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_28 = pBVar2;
  opc = MatchStmt::op((MatchStmt *)cond);
  this_00 = IRBuilder::createMatch(&this->super_IRBuilder,opc,&contBlock->super_Value);
  this_01 = MatchStmt::cases_abi_cxx11_((MatchStmt *)cond);
  __end2 = std::__cxx11::
           list<std::pair<std::__cxx11::list<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>,_std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>_>,_std::allocator<std::pair<std::__cxx11::list<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>,_std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>_>_>_>
           ::begin(this_01);
  one = (Case *)std::__cxx11::
                list<std::pair<std::__cxx11::list<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>,_std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>_>,_std::allocator<std::pair<std::__cxx11::list<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>,_std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>_>_>_>
                ::end(this_01);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&one);
    if (!bVar1) break;
    bb = (BasicBlock *)
         std::
         _List_iterator<std::pair<std::__cxx11::list<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>,_std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>_>_>
         ::operator*(&__end2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"match.case",(allocator<char> *)((long)&__range3 + 7));
    pBVar2 = IRBuilder::createBlock(&this->super_IRBuilder,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    local_90 = pBVar2;
    IRBuilder::setInsertPoint(&this->super_IRBuilder,pBVar2);
    stmt = std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>::get
                     ((unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)
                      &(bb->super_Value).name_._M_string_length);
    codegen(this,stmt);
    IRBuilder::createBr(&this->super_IRBuilder,local_28);
    pBVar2 = bb;
    __end3 = std::__cxx11::
             list<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
             ::begin((list<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                      *)bb);
    labelNode = (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                std::__cxx11::
                list<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                ::end((list<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                       *)pBVar2);
    while( true ) {
      bVar1 = std::operator!=(&__end3,(_Self *)&labelNode);
      if (!bVar1) break;
      label = (Constant *)
              std::
              _List_const_iterator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>
              ::operator*(&__end3);
      expr_00 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::get
                          ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                           label);
      elseBlock = (BasicBlock *)getConstant(this,expr_00);
      MatchInstr::addCase(this_00,(Constant *)elseBlock,local_90);
      std::
      _List_const_iterator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>
      ::operator++(&__end3);
    }
    std::
    _List_iterator<std::pair<std::__cxx11::list<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>,_std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>_>_>
    ::operator++(&__end2);
  }
  pSVar3 = MatchStmt::elseStmt((MatchStmt *)cond);
  if (pSVar3 == (Stmt *)0x0) {
    MatchInstr::setElseBlock(this_00,local_28);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"match.else",&local_109)
    ;
    pBVar2 = IRBuilder::createBlock(&this->super_IRBuilder,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    local_e8 = pBVar2;
    IRBuilder::setInsertPoint(&this->super_IRBuilder,pBVar2);
    pSVar3 = MatchStmt::elseStmt((MatchStmt *)cond);
    codegen(this,pSVar3);
    IRBuilder::createBr(&this->super_IRBuilder,local_28);
    MatchInstr::setElseBlock(this_00,local_e8);
  }
  IRBuilder::setInsertPoint(&this->super_IRBuilder,local_28);
  return extraout_EAX;
}

Assistant:

void IRGenerator::accept(MatchStmt& matchStmt) {
  Value* cond = codegen(matchStmt.condition());
  BasicBlock* contBlock = createBlock("match.cont");
  MatchInstr* matchInstr = createMatch(matchStmt.op(), cond);

  for (const MatchStmt::Case& one : matchStmt.cases()) {
    BasicBlock* bb = createBlock("match.case");
    setInsertPoint(bb);
    codegen(one.second.get());
    createBr(contBlock);

    for (auto& labelNode : one.first) {
      Constant* label = getConstant(labelNode.get());
      matchInstr->addCase(label, bb);
    }
  }

  if (matchStmt.elseStmt()) {
    BasicBlock* elseBlock = createBlock("match.else");
    setInsertPoint(elseBlock);
    codegen(matchStmt.elseStmt());
    createBr(contBlock);

    matchInstr->setElseBlock(elseBlock);
  } else {
    matchInstr->setElseBlock(contBlock);
  }

  setInsertPoint(contBlock);
}